

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  CRef cr_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  Lit l_00;
  Lit *pLVar6;
  Clause *pCVar7;
  vec<unsigned_int> *pvVar8;
  Clause *other;
  bool local_a5;
  Lit local_78;
  int local_74;
  Lit l_1;
  int j;
  CRef *cs;
  vec<unsigned_int> *_cs;
  int local_54;
  int local_50;
  int local_4c;
  int i;
  lbool local_41;
  Var best;
  lbool local_39;
  Clause *local_38;
  Clause *c;
  CRef cr;
  Lit l;
  int deleted_literals;
  int subsumed;
  int cnt;
  bool verbose_local;
  SimpSolver *this_local;
  
  deleted_literals = 0;
  l.x = 0;
  cr = 0;
  iVar2 = Solver::decisionLevel(&this->super_Solver);
  if (iVar2 != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x163,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  do {
    do {
      iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue);
      bVar1 = true;
      if (iVar2 < 1) {
        iVar2 = this->bwdsub_assigns;
        iVar3 = vec<Gluco::Lit>::size(&(this->super_Solver).trail);
        bVar1 = iVar2 < iVar3;
      }
      if (!bVar1) {
        return true;
      }
      if (((this->super_Solver).asynch_interrupt & 1U) != 0) {
        Queue<unsigned_int>::clear(&this->subsumption_queue,false);
        iVar2 = vec<Gluco::Lit>::size(&(this->super_Solver).trail);
        this->bwdsub_assigns = iVar2;
        return true;
      }
      iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue);
      if ((iVar2 == 0) &&
         (iVar2 = this->bwdsub_assigns, iVar3 = vec<Gluco::Lit>::size(&(this->super_Solver).trail),
         iVar2 < iVar3)) {
        iVar2 = this->bwdsub_assigns;
        this->bwdsub_assigns = iVar2 + 1;
        pLVar6 = vec<Gluco::Lit>::operator[](&(this->super_Solver).trail,iVar2);
        c._4_4_ = pLVar6->x;
        pCVar7 = ClauseAllocator::operator[](&(this->super_Solver).ca,this->bwdsub_tmpunit);
        pLVar6 = Clause::operator[](pCVar7,0);
        pLVar6->x = c._4_4_;
        pCVar7 = ClauseAllocator::operator[](&(this->super_Solver).ca,this->bwdsub_tmpunit);
        Clause::calcAbstraction(pCVar7);
        Queue<unsigned_int>::insert(&this->subsumption_queue,this->bwdsub_tmpunit);
      }
      c._0_4_ = Queue<unsigned_int>::peek(&this->subsumption_queue);
      Queue<unsigned_int>::pop(&this->subsumption_queue);
      local_38 = ClauseAllocator::operator[](&(this->super_Solver).ca,(uint)c);
      uVar4 = Clause::mark(local_38);
    } while (uVar4 != 0);
    if (((verbose) && (1 < (this->super_Solver).verbosity)) &&
       (iVar2 = deleted_literals + 1, iVar3 = deleted_literals % 1000, deleted_literals = iVar2,
       iVar3 == 0)) {
      uVar5 = Queue<unsigned_int>::size(&this->subsumption_queue);
      printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",(ulong)uVar5,
             (ulong)(uint)l.x,(ulong)cr);
    }
    iVar2 = Clause::size(local_38);
    local_a5 = true;
    if (iVar2 < 2) {
      pLVar6 = Clause::operator[](local_38,0);
      best = pLVar6->x;
      local_39 = Solver::value(&this->super_Solver,(Lit)best);
      lbool::lbool(&local_41,'\0');
      local_a5 = lbool::operator==(&local_39,local_41);
    }
    if (local_a5 == false) {
      __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                    ,0x17c,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
    }
    pLVar6 = Clause::operator[](local_38,0);
    local_4c = pLVar6->x;
    i = Gluco::var((Lit)local_4c);
    for (local_50 = 1; iVar2 = local_50, iVar3 = Clause::size(local_38), iVar2 < iVar3;
        local_50 = local_50 + 1) {
      pLVar6 = Clause::operator[](local_38,local_50);
      local_54 = Gluco::var((Lit)pLVar6->x);
      pvVar8 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::operator[]
                         (&this->occurs,&local_54);
      iVar2 = vec<unsigned_int>::size(pvVar8);
      pvVar8 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::operator[]
                         (&this->occurs,&i);
      iVar3 = vec<unsigned_int>::size(pvVar8);
      if (iVar2 < iVar3) {
        pLVar6 = Clause::operator[](local_38,local_50);
        i = Gluco::var((Lit)pLVar6->x);
      }
    }
    pvVar8 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                       (&this->occurs,&i);
    _l_1 = Gluco::vec::operator_cast_to_unsigned_int_((vec *)pvVar8);
    local_74 = 0;
    while ((iVar2 = local_74, iVar3 = vec<unsigned_int>::size(pvVar8), iVar2 < iVar3 &&
           (uVar4 = Clause::mark(local_38), uVar4 == 0))) {
      pCVar7 = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
      uVar4 = Clause::mark(pCVar7);
      if ((uVar4 == 0) && (_l_1[local_74] != (uint)c)) {
        if (this->subsumption_lim != -1) {
          pCVar7 = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
          iVar2 = Clause::size(pCVar7);
          if (this->subsumption_lim <= iVar2) goto LAB_00733a0b;
        }
        pCVar7 = local_38;
        other = ClauseAllocator::operator[](&(this->super_Solver).ca,_l_1[local_74]);
        local_78 = Clause::subsumes(pCVar7,other);
        bVar1 = Gluco::Lit::operator==(&local_78,(Lit)0xfffffffe);
        if (bVar1) {
          l.x = l.x + 1;
          removeClause(this,_l_1[local_74]);
        }
        else {
          bVar1 = Gluco::Lit::operator!=(&local_78,(Lit)0xffffffff);
          if (bVar1) {
            cr = cr + 1;
            cr_00 = _l_1[local_74];
            l_00 = operator~(local_78);
            bVar1 = strengthenClause(this,cr_00,l_00);
            if (!bVar1) {
              return false;
            }
            iVar2 = Gluco::var(local_78);
            if (iVar2 == i) {
              local_74 = local_74 + -1;
            }
          }
        }
      }
LAB_00733a0b:
      local_74 = local_74 + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}